

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglChooseConfigReference.cpp
# Opt level: O0

void deqp::egl::chooseConfigReference
               (Library *egl,EGLDisplay display,vector<void_*,_std::allocator<void_*>_> *dst,
               vector<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>
               *attributes)

{
  pointer *__return_storage_ptr__;
  pointer pSVar1;
  bool yuvPlaneBppSpecified;
  size_type sVar2;
  pointer pSVar3;
  reference ppvVar4;
  reference pvVar5;
  reference this;
  EGLConfig pvVar6;
  ulong local_1b8;
  size_t ndx_2;
  CompareConfigs local_1a7;
  __normal_iterator<deqp::egl::SurfaceConfig_*,_std::vector<deqp::egl::SurfaceConfig,_std::allocator<deqp::egl::SurfaceConfig>_>_>
  local_1a0;
  __normal_iterator<deqp::egl::SurfaceConfig_*,_std::vector<deqp::egl::SurfaceConfig,_std::allocator<deqp::egl::SurfaceConfig>_>_>
  local_198;
  undefined1 local_190 [8];
  vector<deqp::egl::SurfaceConfig,_std::allocator<deqp::egl::SurfaceConfig>_> filteredConfigs;
  undefined1 local_160 [8];
  ConfigFilter configFilter;
  ulong local_90;
  size_t ndx_1;
  vector<deqp::egl::SurfaceConfig,_std::allocator<deqp::egl::SurfaceConfig>_> configs;
  size_t ndx;
  undefined1 local_58 [8];
  vector<eglu::ConfigInfo,_std::allocator<eglu::ConfigInfo>_> configInfos;
  vector<void_*,_std::allocator<void_*>_> eglConfigs;
  vector<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>
  *attributes_local;
  vector<void_*,_std::allocator<void_*>_> *dst_local;
  EGLDisplay display_local;
  Library *egl_local;
  
  __return_storage_ptr__ =
       &configInfos.super__Vector_base<eglu::ConfigInfo,_std::allocator<eglu::ConfigInfo>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage;
  eglu::getConfigs((vector<void_*,_std::allocator<void_*>_> *)__return_storage_ptr__,egl,display);
  std::vector<eglu::ConfigInfo,_std::allocator<eglu::ConfigInfo>_>::vector
            ((vector<eglu::ConfigInfo,_std::allocator<eglu::ConfigInfo>_> *)local_58);
  sVar2 = std::vector<void_*,_std::allocator<void_*>_>::size
                    ((vector<void_*,_std::allocator<void_*>_> *)__return_storage_ptr__);
  std::vector<eglu::ConfigInfo,_std::allocator<eglu::ConfigInfo>_>::resize
            ((vector<eglu::ConfigInfo,_std::allocator<eglu::ConfigInfo>_> *)local_58,sVar2);
  configs.super__Vector_base<deqp::egl::SurfaceConfig,_std::allocator<deqp::egl::SurfaceConfig>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  while( true ) {
    pSVar1 = configs.
             super__Vector_base<deqp::egl::SurfaceConfig,_std::allocator<deqp::egl::SurfaceConfig>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
    pSVar3 = (pointer)std::vector<void_*,_std::allocator<void_*>_>::size
                                ((vector<void_*,_std::allocator<void_*>_> *)
                                 &configInfos.
                                  super__Vector_base<eglu::ConfigInfo,_std::allocator<eglu::ConfigInfo>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
    if (pSVar3 <= pSVar1) break;
    ppvVar4 = std::vector<void_*,_std::allocator<void_*>_>::operator[]
                        ((vector<void_*,_std::allocator<void_*>_> *)
                         &configInfos.
                          super__Vector_base<eglu::ConfigInfo,_std::allocator<eglu::ConfigInfo>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage,
                         (size_type)
                         configs.
                         super__Vector_base<deqp::egl::SurfaceConfig,_std::allocator<deqp::egl::SurfaceConfig>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
    pvVar6 = *ppvVar4;
    pvVar5 = std::vector<eglu::ConfigInfo,_std::allocator<eglu::ConfigInfo>_>::operator[]
                       ((vector<eglu::ConfigInfo,_std::allocator<eglu::ConfigInfo>_> *)local_58,
                        (size_type)
                        configs.
                        super__Vector_base<deqp::egl::SurfaceConfig,_std::allocator<deqp::egl::SurfaceConfig>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
    eglu::queryCoreConfigInfo(egl,display,pvVar6,pvVar5);
    ppvVar4 = std::vector<void_*,_std::allocator<void_*>_>::operator[]
                        ((vector<void_*,_std::allocator<void_*>_> *)
                         &configInfos.
                          super__Vector_base<eglu::ConfigInfo,_std::allocator<eglu::ConfigInfo>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage,
                         (size_type)
                         configs.
                         super__Vector_base<deqp::egl::SurfaceConfig,_std::allocator<deqp::egl::SurfaceConfig>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
    pvVar6 = *ppvVar4;
    pvVar5 = std::vector<eglu::ConfigInfo,_std::allocator<eglu::ConfigInfo>_>::operator[]
                       ((vector<eglu::ConfigInfo,_std::allocator<eglu::ConfigInfo>_> *)local_58,
                        (size_type)
                        configs.
                        super__Vector_base<deqp::egl::SurfaceConfig,_std::allocator<deqp::egl::SurfaceConfig>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
    eglu::queryExtConfigInfo(egl,display,pvVar6,pvVar5);
    configs.super__Vector_base<deqp::egl::SurfaceConfig,_std::allocator<deqp::egl::SurfaceConfig>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)((long)&(configs.
                           super__Vector_base<deqp::egl::SurfaceConfig,_std::allocator<deqp::egl::SurfaceConfig>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage)->m_config + 1);
  }
  std::vector<deqp::egl::SurfaceConfig,_std::allocator<deqp::egl::SurfaceConfig>_>::vector
            ((vector<deqp::egl::SurfaceConfig,_std::allocator<deqp::egl::SurfaceConfig>_> *)&ndx_1);
  local_90 = 0;
  while( true ) {
    sVar2 = std::vector<void_*,_std::allocator<void_*>_>::size
                      ((vector<void_*,_std::allocator<void_*>_> *)
                       &configInfos.
                        super__Vector_base<eglu::ConfigInfo,_std::allocator<eglu::ConfigInfo>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage);
    if (sVar2 <= local_90) break;
    ppvVar4 = std::vector<void_*,_std::allocator<void_*>_>::operator[]
                        ((vector<void_*,_std::allocator<void_*>_> *)
                         &configInfos.
                          super__Vector_base<eglu::ConfigInfo,_std::allocator<eglu::ConfigInfo>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage,local_90);
    pvVar6 = *ppvVar4;
    pvVar5 = std::vector<eglu::ConfigInfo,_std::allocator<eglu::ConfigInfo>_>::operator[]
                       ((vector<eglu::ConfigInfo,_std::allocator<eglu::ConfigInfo>_> *)local_58,
                        local_90);
    SurfaceConfig::SurfaceConfig
              ((SurfaceConfig *)
               &configFilter.m_rules._M_t._M_impl.super__Rb_tree_header._M_node_count,pvVar6,pvVar5)
    ;
    std::vector<deqp::egl::SurfaceConfig,_std::allocator<deqp::egl::SurfaceConfig>_>::push_back
              ((vector<deqp::egl::SurfaceConfig,_std::allocator<deqp::egl::SurfaceConfig>_> *)&ndx_1
               ,(value_type *)&configFilter.m_rules._M_t._M_impl.super__Rb_tree_header._M_node_count
              );
    local_90 = local_90 + 1;
  }
  ConfigFilter::ConfigFilter((ConfigFilter *)local_160);
  std::vector<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>::vector
            ((vector<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_> *
             )&filteredConfigs.
               super__Vector_base<deqp::egl::SurfaceConfig,_std::allocator<deqp::egl::SurfaceConfig>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage,attributes);
  ConfigFilter::setValues
            ((ConfigFilter *)local_160,
             (vector<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_> *
             )&filteredConfigs.
               super__Vector_base<deqp::egl::SurfaceConfig,_std::allocator<deqp::egl::SurfaceConfig>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>::~vector
            ((vector<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_> *
             )&filteredConfigs.
               super__Vector_base<deqp::egl::SurfaceConfig,_std::allocator<deqp::egl::SurfaceConfig>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
  ConfigFilter::filter
            ((vector<deqp::egl::SurfaceConfig,_std::allocator<deqp::egl::SurfaceConfig>_> *)
             local_190,(ConfigFilter *)local_160,
             (vector<deqp::egl::SurfaceConfig,_std::allocator<deqp::egl::SurfaceConfig>_> *)&ndx_1);
  local_198._M_current =
       (SurfaceConfig *)
       std::vector<deqp::egl::SurfaceConfig,_std::allocator<deqp::egl::SurfaceConfig>_>::begin
                 ((vector<deqp::egl::SurfaceConfig,_std::allocator<deqp::egl::SurfaceConfig>_> *)
                  local_190);
  local_1a0._M_current =
       (SurfaceConfig *)
       std::vector<deqp::egl::SurfaceConfig,_std::allocator<deqp::egl::SurfaceConfig>_>::end
                 ((vector<deqp::egl::SurfaceConfig,_std::allocator<deqp::egl::SurfaceConfig>_> *)
                  local_190);
  ConfigFilter::getSpecifiedRGBColors((ConfigFilter *)((long)&ndx_2 + 5));
  ConfigFilter::getSpecifiedLuminanceColors((ConfigFilter *)((long)&ndx_2 + 3));
  yuvPlaneBppSpecified = ConfigFilter::isYuvPlaneBppSpecified((ConfigFilter *)local_160);
  CompareConfigs::CompareConfigs
            (&local_1a7,(BVec4 *)((long)&ndx_2 + 5),(BVec2 *)((long)&ndx_2 + 3),yuvPlaneBppSpecified
            );
  std::
  sort<__gnu_cxx::__normal_iterator<deqp::egl::SurfaceConfig*,std::vector<deqp::egl::SurfaceConfig,std::allocator<deqp::egl::SurfaceConfig>>>,deqp::egl::CompareConfigs>
            (local_198,local_1a0,&local_1a7);
  sVar2 = std::vector<deqp::egl::SurfaceConfig,_std::allocator<deqp::egl::SurfaceConfig>_>::size
                    ((vector<deqp::egl::SurfaceConfig,_std::allocator<deqp::egl::SurfaceConfig>_> *)
                     local_190);
  std::vector<void_*,_std::allocator<void_*>_>::resize(dst,sVar2);
  local_1b8 = 0;
  while( true ) {
    sVar2 = std::vector<deqp::egl::SurfaceConfig,_std::allocator<deqp::egl::SurfaceConfig>_>::size
                      ((vector<deqp::egl::SurfaceConfig,_std::allocator<deqp::egl::SurfaceConfig>_>
                        *)local_190);
    if (sVar2 <= local_1b8) break;
    this = std::vector<deqp::egl::SurfaceConfig,_std::allocator<deqp::egl::SurfaceConfig>_>::
           operator[]((vector<deqp::egl::SurfaceConfig,_std::allocator<deqp::egl::SurfaceConfig>_> *
                      )local_190,local_1b8);
    pvVar6 = SurfaceConfig::getEglConfig(this);
    ppvVar4 = std::vector<void_*,_std::allocator<void_*>_>::operator[](dst,local_1b8);
    *ppvVar4 = pvVar6;
    local_1b8 = local_1b8 + 1;
  }
  std::vector<deqp::egl::SurfaceConfig,_std::allocator<deqp::egl::SurfaceConfig>_>::~vector
            ((vector<deqp::egl::SurfaceConfig,_std::allocator<deqp::egl::SurfaceConfig>_> *)
             local_190);
  ConfigFilter::~ConfigFilter((ConfigFilter *)local_160);
  std::vector<deqp::egl::SurfaceConfig,_std::allocator<deqp::egl::SurfaceConfig>_>::~vector
            ((vector<deqp::egl::SurfaceConfig,_std::allocator<deqp::egl::SurfaceConfig>_> *)&ndx_1);
  std::vector<eglu::ConfigInfo,_std::allocator<eglu::ConfigInfo>_>::~vector
            ((vector<eglu::ConfigInfo,_std::allocator<eglu::ConfigInfo>_> *)local_58);
  std::vector<void_*,_std::allocator<void_*>_>::~vector
            ((vector<void_*,_std::allocator<void_*>_> *)
             &configInfos.super__Vector_base<eglu::ConfigInfo,_std::allocator<eglu::ConfigInfo>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

void chooseConfigReference (const Library& egl, EGLDisplay display, std::vector<EGLConfig>& dst, const std::vector<std::pair<EGLenum, EGLint> >& attributes)
{
	// Get all configs
	std::vector<EGLConfig> eglConfigs = eglu::getConfigs(egl, display);

	// Config infos - including extension attributes
	std::vector<ConfigInfo> configInfos;
	configInfos.resize(eglConfigs.size());

	for (size_t ndx = 0; ndx < eglConfigs.size(); ndx++)
	{
		eglu::queryCoreConfigInfo(egl, display, eglConfigs[ndx], &configInfos[ndx]);
		eglu::queryExtConfigInfo(egl, display, eglConfigs[ndx], &configInfos[ndx]);
	}

	// Pair configs with info
	std::vector<SurfaceConfig> configs;
	for (size_t ndx = 0; ndx < eglConfigs.size(); ndx++)
		configs.push_back(SurfaceConfig(eglConfigs[ndx], configInfos[ndx]));

	// Filter configs
	ConfigFilter configFilter;
	configFilter.setValues(attributes);

	std::vector<SurfaceConfig> filteredConfigs = configFilter.filter(configs);

	// Sort configs
	std::sort(filteredConfigs.begin(), filteredConfigs.end(), CompareConfigs(configFilter.getSpecifiedRGBColors(), configFilter.getSpecifiedLuminanceColors(), configFilter.isYuvPlaneBppSpecified()));

	// Write to dst list
	dst.resize(filteredConfigs.size());
	for (size_t ndx = 0; ndx < filteredConfigs.size(); ndx++)
		dst[ndx] = filteredConfigs[ndx].getEglConfig();
}